

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Map.hpp
# Opt level: O3

void __thiscall Map<String,_String>::Item::updateHeightAndSlope(Item *this)

{
  Item *pIVar1;
  code *pcVar2;
  int iVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  
  pIVar1 = this->parent;
  if (((pIVar1 != (Item *)0x0) && (pIVar1->left != this)) && (pIVar1->right != this)) {
    iVar3 = Debug::printf("%s:%u: assertion failed: %s\n",
                          "/workspace/llm4binary/github/license_c_cmakelists/craflin[P]libnstd/src/../include/nstd/Map.hpp"
                          ,0x16f,"!parent || this == parent->left || this == parent->right");
    if (iVar3 != 0) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
  }
  if (this->left == (Item *)0x0) {
    uVar4 = 0;
  }
  else {
    uVar4 = this->left->height;
  }
  if (this->right == (Item *)0x0) {
    uVar5 = 0;
  }
  else {
    uVar5 = this->right->height;
  }
  uVar6 = uVar5;
  if (uVar5 <= uVar4 && uVar4 - uVar5 != 0) {
    uVar6 = uVar4;
  }
  this->slope = uVar4 - uVar5;
  this->height = uVar6 + 1;
  return;
}

Assistant:

void updateHeightAndSlope()
    {
      ASSERT(!parent || this == parent->left || this == parent->right);
      usize leftHeight = left ? left->height : 0;
      usize rightHeight = right ? right->height : 0;
      slope = leftHeight - rightHeight;
      height = (leftHeight > rightHeight ? leftHeight : rightHeight) + 1;
    }